

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O0

int reset(int x)

{
  undefined4 local_10;
  undefined4 local_c;
  int num;
  int x_local;
  
  local_10 = 0;
  for (local_c = x; local_c != 0; local_c = local_c / 10) {
    local_10 = local_10 * 10 + local_c % 10;
  }
  return local_10;
}

Assistant:

int reset(int x) //把数字反转
{
    int num = 0;
    while (x)
    {
        num = num * 10 + x % 10;                    // 把一个数翻转过来，就只需要把每次求余的结果加上上一次求余结果*10
        x /= 10;                                    //除10，向前进一位处理
    }
    return num;
}